

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

size_t secp256k1_surjectionproof_csprng_next
                 (secp256k1_surjectionproof_csprng *csprng,size_t rand_max)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_a0 [8];
  secp256k1_sha256 sha;
  size_t val;
  size_t limit;
  size_t selection_range;
  size_t increment;
  size_t rand_max_local;
  secp256k1_surjectionproof_csprng *csprng_local;
  
  iVar1 = 1;
  if (0x100 < rand_max) {
    iVar1 = 2;
  }
  uVar2 = (ulong)iVar1;
  iVar1 = 0xff;
  if (0x100 < rand_max) {
    iVar1 = 0xffff;
  }
  do {
    if (0x1f < csprng->state_i + uVar2) {
      secp256k1_sha256_initialize((secp256k1_sha256 *)local_a0);
      secp256k1_sha256_write((secp256k1_sha256 *)local_a0,csprng->state,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)local_a0,csprng->state);
      csprng->state_i = 0;
    }
    sha.bytes = (uint64_t)csprng->state[csprng->state_i];
    if (1 < uVar2) {
      sha.bytes = sha.bytes * 0x100 + (ulong)csprng->state[csprng->state_i + 1];
    }
    csprng->state_i = uVar2 + csprng->state_i;
  } while ((((long)iVar1 + 1U) / rand_max) * rand_max <= sha.bytes);
  return sha.bytes % rand_max;
}

Assistant:

static size_t secp256k1_surjectionproof_csprng_next(secp256k1_surjectionproof_csprng *csprng, size_t rand_max) {
    /* The number of random bytes to read for each random sample */
    const size_t increment = rand_max > 256 ? 2 : 1;
    /* The maximum value expressable by the number of random bytes we read */
    const size_t selection_range = rand_max > 256 ? 0xffff : 0xff;
    /* The largest multiple of rand_max that fits within selection_range */
    const size_t limit = ((selection_range + 1) / rand_max) * rand_max;

    while (1) {
        size_t val;
        if (csprng->state_i + increment >= 32) {
            secp256k1_sha256 sha;
            secp256k1_sha256_initialize(&sha);
            secp256k1_sha256_write(&sha, csprng->state, 32);
            secp256k1_sha256_finalize(&sha, csprng->state);
            csprng->state_i = 0;
        }
        val = csprng->state[csprng->state_i];
        if (increment > 1) {
            val = (val << 8) + csprng->state[csprng->state_i + 1];
        }
        csprng->state_i += increment;
        /* Accept only values below our limit. Values equal to or above the limit are
         * biased because they comprise only a subset of the range (0, rand_max - 1) */
        if (val < limit) {
            return val % rand_max;
        }
    }
}